

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O1

bool ImGui::TabItemEx(ImGuiTabBar *tab_bar,char *label,bool *p_open,ImGuiTabItemFlags flags,
                     ImGuiWindow *docked_window)

{
  ImVec2 *pIVar1;
  ImGuiTabItem *pIVar2;
  float fVar3;
  int iVar4;
  int iVar5;
  char cVar6;
  ImDrawList *draw_list;
  ImVec2 IVar7;
  ImGuiWindow *pIVar8;
  char *label_00;
  undefined1 auVar9 [16];
  ulong uVar10;
  bool bVar11;
  ImU32 id;
  int iVar12;
  ImU32 col;
  ImGuiID close_button_id;
  ulong uVar13;
  ImGuiTabItem *__dest;
  size_t sVar14;
  char *pcVar15;
  uint flags_00;
  int iVar16;
  ImGuiTabItem *pIVar17;
  ImGuiDockNode *pIVar18;
  ImS8 IVar19;
  int iVar20;
  ImGuiCol idx;
  ulong uVar21;
  uint uVar22;
  ImGuiTabItem *pIVar23;
  ImGuiContext *ctx;
  bool bVar24;
  float fVar25;
  undefined4 extraout_XMM0_Dc;
  undefined4 uVar26;
  undefined4 extraout_XMM0_Dd;
  undefined4 uVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  ImRect bb;
  bool held;
  bool hovered;
  ImRect local_a8;
  ImVec2 local_90;
  ImGuiWindow *local_88;
  uint local_7c;
  ImGuiTextBuffer *local_78;
  ImGuiContext *local_70;
  ImVec2 local_68;
  bool *local_60;
  char *local_58;
  int local_50;
  int local_4c;
  undefined1 local_48 [8];
  undefined4 uStack_40;
  undefined4 uStack_3c;
  
  __dest = (ImGuiTabItem *)(ulong)(uint)flags;
  if (tab_bar->WantLayout == true) {
    TabBarLayout(tab_bar);
  }
  local_70 = GImGui;
  local_88 = GImGui->CurrentWindow;
  if (local_88->SkipItems != false) {
    return false;
  }
  id = TabBarCalcTabID(tab_bar,label);
  if ((p_open != (bool *)0x0) && (*p_open == false)) {
    PushItemFlag(0x18,true);
    uVar13 = 0;
    goto LAB_00195e22;
  }
  local_60 = (bool *)0x0;
  flags_00 = flags;
  if (((uint)flags >> 0x14 & 1) == 0) {
    local_60 = p_open;
    flags_00 = flags | 0x100000;
  }
  if (p_open != (bool *)0x0) {
    flags_00 = flags;
  }
  IVar7 = TabItemCalcSize(label,local_60 != (bool *)0x0);
  fVar25 = IVar7.x;
  local_a8.Max.y = IVar7.y;
  if (id == 0) {
LAB_00195bb6:
    p_open = (bool *)0x0;
  }
  else {
    uVar13 = (ulong)(tab_bar->Tabs).Size;
    bVar24 = 0 < (long)uVar13;
    if (0 < (long)uVar13) {
      p_open = (bool *)(tab_bar->Tabs).Data;
      bVar24 = true;
      if (((ImGuiTabItem *)p_open)->ID != id) {
        pIVar17 = (ImGuiTabItem *)((long)p_open + (uVar13 - 1) * 0x28);
        uVar10 = 1;
        pIVar23 = (ImGuiTabItem *)p_open;
        do {
          uVar21 = uVar10;
          p_open = (bool *)pIVar17;
          if (uVar13 == uVar21) break;
          p_open = (bool *)(pIVar23 + 1);
          pIVar2 = pIVar23 + 1;
          uVar10 = uVar21 + 1;
          pIVar23 = (ImGuiTabItem *)p_open;
        } while (pIVar2->ID != id);
        bVar24 = uVar21 < uVar13;
      }
    }
    if (!bVar24) goto LAB_00195bb6;
  }
  pIVar23 = (ImGuiTabItem *)p_open;
  uVar26 = extraout_XMM0_Dc;
  uVar27 = extraout_XMM0_Dd;
  if ((ImGuiTabItem *)p_open == (ImGuiTabItem *)0x0) {
    iVar20 = (tab_bar->Tabs).Size;
    iVar4 = (tab_bar->Tabs).Capacity;
    uVar26 = extraout_XMM0_Dc;
    uVar27 = extraout_XMM0_Dd;
    if (iVar20 == iVar4) {
      iVar20 = iVar20 + 1;
      if (iVar4 == 0) {
        iVar16 = 8;
      }
      else {
        iVar16 = iVar4 / 2 + iVar4;
      }
      if (iVar20 < iVar16) {
        iVar20 = iVar16;
      }
      uVar26 = extraout_XMM0_Dc;
      uVar27 = extraout_XMM0_Dd;
      if (iVar4 < iVar20) {
        uStack_40 = extraout_XMM0_Dc;
        local_48._0_4_ = IVar7.x;
        local_48._4_4_ = IVar7.y;
        uStack_3c = extraout_XMM0_Dd;
        __dest = (ImGuiTabItem *)MemAlloc((long)iVar20 * 0x28);
        pIVar23 = (tab_bar->Tabs).Data;
        if (pIVar23 != (ImGuiTabItem *)0x0) {
          memcpy(__dest,pIVar23,(long)(tab_bar->Tabs).Size * 0x28);
          MemFree((tab_bar->Tabs).Data);
        }
        (tab_bar->Tabs).Data = __dest;
        (tab_bar->Tabs).Capacity = iVar20;
        fVar25 = (float)local_48._0_4_;
        local_a8.Max.y = (float)local_48._4_4_;
        uVar26 = uStack_40;
        uVar27 = uStack_3c;
      }
    }
    pIVar17 = (tab_bar->Tabs).Data;
    iVar20 = (tab_bar->Tabs).Size;
    pIVar23 = pIVar17 + iVar20;
    pIVar23->ID = 0;
    pIVar23->Flags = 0;
    pIVar23->Window = (ImGuiWindow *)0x0;
    pIVar17[iVar20].LastFrameVisible = -1;
    pIVar17[iVar20].LastFrameSelected = -1;
    pIVar17[iVar20].NameOffset = -1;
    pIVar17[iVar20].Offset = 0.0;
    pIVar17[iVar20].Width = 0.0;
    pIVar17[iVar20].ContentWidth = 0.0;
    iVar20 = (tab_bar->Tabs).Size;
    (tab_bar->Tabs).Size = iVar20 + 1;
    pIVar17 = (tab_bar->Tabs).Data;
    pIVar23 = pIVar17 + iVar20;
    pIVar23->ID = id;
    pIVar17[iVar20].Width = fVar25;
  }
  tab_bar->LastTabItemIdx =
       (short)((uint)((int)pIVar23 - *(int *)&(tab_bar->Tabs).Data) >> 3) * -0x3333;
  pIVar23->ContentWidth = fVar25;
  iVar20 = tab_bar->PrevFrameVisible;
  local_7c = tab_bar->Flags;
  iVar4 = local_70->FrameCount;
  iVar16 = pIVar23->LastFrameVisible + 1;
  pIVar23->LastFrameVisible = iVar4;
  pIVar23->Flags = flags_00;
  pIVar23->Window = docked_window;
  local_58 = label;
  if ((local_7c >> 0x14 & 1) == 0) {
    local_78 = &tab_bar->TabsNames;
    iVar5 = (tab_bar->TabsNames).Buf.Size;
    iVar12 = iVar5 + -1;
    if (iVar5 == 0) {
      iVar12 = 0;
    }
    pIVar23->NameOffset = iVar12;
    local_48._4_4_ = local_a8.Max.y;
    local_48._0_4_ = fVar25;
    uStack_40 = uVar26;
    uStack_3c = uVar27;
    sVar14 = strlen(label);
    ctx = local_70;
    ImGuiTextBuffer::append(local_78,label,label + sVar14 + 1);
    __dest = pIVar23;
    local_a8.Max.y = (float)local_48._4_4_;
  }
  else {
    pIVar23->NameOffset = -1;
    ctx = local_70;
  }
  pIVar8 = local_88;
  iVar20 = iVar20 + 1;
  if (iVar16 < iVar4) {
    if ((((tab_bar->Flags & 2U) != 0) && (tab_bar->NextSelectedTabId == 0)) &&
       ((iVar4 <= iVar20 || (tab_bar->SelectedTabId == 0)))) {
      tab_bar->NextSelectedTabId = id;
    }
  }
  else if ((tab_bar->Flags & 1U) == 0) {
    fVar25 = tab_bar->OffsetNextTab;
    pIVar23->Offset = fVar25;
    tab_bar->OffsetNextTab = pIVar23->Width + (ctx->Style).ItemInnerSpacing.x + fVar25;
  }
  if (((flags_00 & 2) != 0) && (tab_bar->SelectedTabId != id)) {
    tab_bar->NextSelectedTabId = id;
  }
  if (tab_bar->VisibleTabId == id) {
    tab_bar->VisibleTabWasSubmitted = true;
    uVar13 = CONCAT71((int7)((ulong)__dest >> 8),1);
  }
  else {
    uVar13 = 0;
    if (((tab_bar->SelectedTabId == 0) && (docked_window == (ImGuiWindow *)0x0)) && (iVar20 < iVar4)
       ) {
      if ((tab_bar->Tabs).Size == 1) {
        uVar13 = (ulong)((tab_bar->Flags & 2) == 0);
      }
      else {
        uVar13 = 0;
      }
    }
  }
  if ((iVar16 < iVar4) && ((ImGuiTabItem *)p_open == (ImGuiTabItem *)0x0 || iVar4 <= iVar20)) {
    PushItemFlag(0x18,true);
LAB_00195e22:
    local_a8.Max.x = 0.0;
    local_a8.Max.y = 0.0;
    local_a8.Min.x = 0.0;
    local_a8.Min.y = 0.0;
    ItemAdd(&local_a8,id,(ImRect *)0x0);
    PopItemFlag();
    return SUB81(uVar13,0);
  }
  if (tab_bar->SelectedTabId == id) {
    pIVar23->LastFrameSelected = ctx->FrameCount;
  }
  local_48._0_4_ = (local_88->DC).CursorPos.x;
  local_48._4_4_ = (local_88->DC).CursorPos.y;
  IVar7 = (tab_bar->BarRect).Min;
  local_a8.Min.x = (float)(int)(pIVar23->Offset - tab_bar->ScrollingAnim) + IVar7.x;
  local_a8.Min.y = IVar7.y + 0.0;
  local_a8.Max.x = pIVar23->Width;
  (local_88->DC).CursorPos = local_a8.Min;
  local_a8.Max.x = local_a8.Max.x + local_a8.Min.x;
  local_a8.Max.y = local_a8.Max.y + local_a8.Min.y;
  fVar25 = (tab_bar->BarRect).Min.x;
  bVar24 = true;
  if (fVar25 <= local_a8.Min.x) {
    pIVar1 = &(tab_bar->BarRect).Max;
    bVar24 = pIVar1->x <= local_a8.Max.x && local_a8.Max.x != pIVar1->x;
  }
  local_78 = (ImGuiTextBuffer *)uVar13;
  local_50 = iVar16;
  local_4c = iVar4;
  if (bVar24) {
    local_68.y = local_a8.Min.y + -1.0;
    local_68.x = (float)(~-(uint)(fVar25 <= local_a8.Min.x) & (uint)fVar25 |
                        (uint)local_a8.Min.x & -(uint)(fVar25 <= local_a8.Min.x));
    local_90.x = (tab_bar->BarRect).Max.x;
    local_90.y = local_a8.Max.y;
    PushClipRect(&local_68,&local_90,true);
  }
  IVar7 = (pIVar8->DC).CursorMaxPos;
  local_68.y = local_a8.Max.y - local_a8.Min.y;
  local_68.x = local_a8.Max.x - local_a8.Min.x;
  ItemSize(&local_68,(ctx->Style).FramePadding.y);
  (pIVar8->DC).CursorMaxPos = IVar7;
  bVar11 = ItemAdd(&local_a8,id,(ImRect *)0x0);
  if (!bVar11) {
    if (bVar24) {
      PopClipRect();
    }
    (local_88->DC).CursorPos.x = (float)local_48._0_4_;
    (local_88->DC).CursorPos.y = (float)local_48._4_4_;
    return (bool)(char)local_78;
  }
  uVar22 = 0x44;
  if (ctx->DragDropActive == true) {
    if ((ctx->DragDropPayload).DataFrameCount == -1) {
      uVar22 = 0x1044;
    }
    else {
      iVar20 = strcmp("_IMWINDOW",(ctx->DragDropPayload).DataType);
      uVar22 = (uint)(iVar20 != 0) << 0xc | 0x44;
    }
  }
  bVar11 = ButtonBehavior(&local_a8,id,(bool *)&local_68,(bool *)&local_90,uVar22);
  if (bVar11) {
    tab_bar->NextSelectedTabId = id;
  }
  local_68.x._0_1_ = local_68.x._0_1_ | ctx->HoveredId == id;
  cVar6 = (char)local_78;
  if (local_90.x._0_1_ == '\0') {
    SetItemAllowOverlap();
  }
  if (docked_window == (ImGuiWindow *)0x0) {
    pIVar18 = (ImGuiDockNode *)0x0;
  }
  else {
    pIVar18 = docked_window->DockNode;
  }
  bVar11 = true;
  if (((pIVar18 != (ImGuiDockNode *)0x0) && (pIVar18->ParentNode == (ImGuiDockNode *)0x0)) &&
     ((pIVar18->LocalFlags & 0x400U) == 0)) {
    bVar11 = (pIVar18->Windows).Size != 1;
  }
  if (((local_90.x._0_1_ == '\x01') && (!bVar11)) && (bVar11 = IsMouseDragging(0,0.0), bVar11)) {
    StartMouseMovingWindow(docked_window);
    goto LAB_001962ce;
  }
  if (((local_90.x._0_1_ != '\x01') || (local_50 < local_4c)) ||
     (bVar11 = IsMouseDragging(0,-1.0), !bVar11)) goto LAB_001962ce;
  bVar11 = ctx->DragDropActive;
  fVar25 = 0.0;
  if ((bVar11 == false) && (docked_window != (ImGuiWindow *)0x0 || (tab_bar->Flags & 1U) != 0)) {
    fVar3 = (ctx->IO).MouseDelta.x;
    if (0.0 <= fVar3) {
LAB_00196144:
      if ((fVar3 <= 0.0) || (fVar3 = (ctx->IO).MousePos.x, fVar3 <= local_a8.Max.x))
      goto LAB_00196179;
      fVar25 = fVar3 - local_a8.Max.x;
      IVar19 = '\x01';
    }
    else {
      fVar29 = (ctx->IO).MousePos.x;
      if (local_a8.Min.x <= fVar29) goto LAB_00196144;
      fVar25 = local_a8.Min.x - fVar29;
      IVar19 = -1;
    }
    if ((tab_bar->Flags & 1U) != 0) {
      tab_bar->ReorderRequestTabId = pIVar23->ID;
      tab_bar->ReorderRequestDir = IVar19;
    }
  }
LAB_00196179:
  if ((docked_window != (ImGuiWindow *)0x0) && ((docked_window->Flags & 4) == 0)) {
    if (bVar11 == false) {
      bVar11 = false;
    }
    else {
      bVar11 = (ctx->DragDropPayload).SourceId == id;
    }
    if (!bVar11) {
      fVar3 = ctx->FontSize;
      fVar28 = (ABS((ctx->IO).MouseDragMaxDistanceAbs[0].x) - (fVar3 + fVar3)) * 0.2;
      fVar29 = fVar3 * 4.0;
      if (fVar28 <= fVar3 * 4.0) {
        fVar29 = fVar28;
      }
      fVar31 = (ctx->IO).MousePos.y;
      fVar30 = local_a8.Min.y - fVar31;
      fVar31 = fVar31 - local_a8.Max.y;
      uVar22 = -(uint)(fVar31 <= fVar30);
      if (((float)(~uVar22 & (uint)fVar31 | (uint)fVar30 & uVar22) <
           fVar3 * 1.5 + (float)(~-(uint)(fVar28 < 0.0) & (uint)fVar29)) &&
         ((fVar25 <= fVar3 * 2.2 ||
          (((-1 < tab_bar->ReorderRequestDir ||
            ((int)((ulong)((long)pIVar23 - (long)(tab_bar->Tabs).Data) >> 3) * -0x33333333 != 0)) &&
           ((tab_bar->ReorderRequestDir < '\x01' ||
            ((tab_bar->Tabs).Size + -1 !=
             (int)((ulong)((long)pIVar23 - (long)(tab_bar->Tabs).Data) >> 3) * -0x33333333))))))))
      goto LAB_001962ce;
    }
    DockContextQueueUndockWindow(ctx,docked_window);
    ctx->MovingWindow = docked_window;
    ctx->ActiveId = docked_window->MoveId;
    IVar7.y = (ctx->ActiveIdClickOffset).y - ((docked_window->Pos).y - local_a8.Min.y);
    IVar7.x = (ctx->ActiveIdClickOffset).x - ((docked_window->Pos).x - local_a8.Min.x);
    ctx->ActiveIdClickOffset = IVar7;
  }
LAB_001962ce:
  label_00 = local_58;
  draw_list = local_88->DrawList;
  idx = 0x22;
  if ((local_90.x._0_1_ == '\0') && (local_68.x._0_1_ == '\0')) {
    if (cVar6 == '\0') {
      idx = (uint)((local_7c >> 0x15 & 1) == 0) * 3 + 0x21;
    }
    else {
      idx = (uint)((local_7c >> 0x15 & 1) == 0) * 2 + 0x23;
    }
  }
  col = GetColorU32(idx,1.0);
  TabItemBackground(draw_list,&local_a8,flags_00,col);
  RenderNavHighlight(&local_a8,id,1);
  bVar11 = IsItemHovered(8);
  if ((bVar11) &&
     ((bVar11 = IsMouseClicked(1,false), bVar11 || (bVar11 = IsMouseReleased(1), bVar11)))) {
    tab_bar->NextSelectedTabId = id;
  }
  uVar22 = tab_bar->Flags;
  if (local_60 == (bool *)0x0) {
    close_button_id = 0;
  }
  else {
    close_button_id = ImGuiWindow::GetID(local_88,(void *)((ulong)id + 1));
  }
  bVar11 = TabItemLabelAndCloseButton
                     (draw_list,&local_a8,uVar22 >> 1 & 4 | flags_00,tab_bar->FramePadding,label_00,
                      id,close_button_id);
  if ((local_60 != (bool *)0x0) && (bVar11)) {
    *local_60 = false;
    if (tab_bar->VisibleTabId == pIVar23->ID) {
      if ((pIVar23->Flags & 1U) == 0) {
        pIVar23->LastFrameVisible = -1;
        tab_bar->SelectedTabId = 0;
        tab_bar->NextSelectedTabId = 0;
      }
    }
    else if ((pIVar23->Flags & 1U) != 0) {
      tab_bar->NextSelectedTabId = pIVar23->ID;
    }
  }
  if (bVar24) {
    PopClipRect();
  }
  auVar9 = _local_48;
  (local_88->DC).CursorPos.x = (float)local_48._0_4_;
  (local_88->DC).CursorPos.y = (float)local_48._4_4_;
  if (local_70->HoveredId != id) {
    return (bool)cVar6;
  }
  if (local_90.x._0_1_ != '\0') {
    return (bool)cVar6;
  }
  if (local_70->HoveredIdNotActiveTimer <= 0.5) {
    return (bool)cVar6;
  }
  _local_48 = auVar9;
  bVar24 = IsItemHovered(0);
  if (!bVar24) {
    return (bool)cVar6;
  }
  if ((tab_bar->Flags & 0x20) != 0) {
    return (bool)cVar6;
  }
  pcVar15 = FindRenderedTextEnd(label_00,(char *)0x0);
  SetTooltip("%.*s",(ulong)(uint)((int)pcVar15 - (int)label_00),label_00);
  return (bool)cVar6;
}

Assistant:

bool    ImGui::TabItemEx(ImGuiTabBar* tab_bar, const char* label, bool* p_open, ImGuiTabItemFlags flags, ImGuiWindow* docked_window)
{
    // Layout whole tab bar if not already done
    if (tab_bar->WantLayout)
        TabBarLayout(tab_bar);

    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    if (window->SkipItems)
        return false;

    const ImGuiStyle& style = g.Style;
    const ImGuiID id = TabBarCalcTabID(tab_bar, label);

    // If the user called us with *p_open == false, we early out and don't render. We make a dummy call to ItemAdd() so that attempts to use a contextual popup menu with an implicit ID won't use an older ID.
    if (p_open && !*p_open)
    {
        PushItemFlag(ImGuiItemFlags_NoNav | ImGuiItemFlags_NoNavDefaultFocus, true);
        ItemAdd(ImRect(), id);
        PopItemFlag();
        return false;
    }

    // Store into ImGuiTabItemFlags_NoCloseButton, also honor ImGuiTabItemFlags_NoCloseButton passed by user (although not documented)
    if (flags & ImGuiTabItemFlags_NoCloseButton)
        p_open = NULL;
    else if (p_open == NULL)
        flags |= ImGuiTabItemFlags_NoCloseButton;

    // Calculate tab contents size
    ImVec2 size = TabItemCalcSize(label, p_open != NULL);

    // Acquire tab data
    ImGuiTabItem* tab = TabBarFindTabByID(tab_bar, id);
    bool tab_is_new = false;
    if (tab == NULL)
    {
        tab_bar->Tabs.push_back(ImGuiTabItem());
        tab = &tab_bar->Tabs.back();
        tab->ID = id;
        tab->Width = size.x;
        tab_is_new = true;
    }
    tab_bar->LastTabItemIdx = (short)tab_bar->Tabs.index_from_ptr(tab);
    tab->ContentWidth = size.x;

    const bool tab_bar_appearing = (tab_bar->PrevFrameVisible + 1 < g.FrameCount);
    const bool tab_bar_focused = (tab_bar->Flags & ImGuiTabBarFlags_IsFocused) != 0;
    const bool tab_appearing = (tab->LastFrameVisible + 1 < g.FrameCount);
    tab->LastFrameVisible = g.FrameCount;
    tab->Flags = flags;
    tab->Window = docked_window;

    // Append name with zero-terminator
    if (tab_bar->Flags & ImGuiTabBarFlags_DockNode)
    {
        IM_ASSERT(tab->Window != NULL);
        tab->NameOffset = -1;
    }
    else
    {
        IM_ASSERT(tab->Window == NULL);
        tab->NameOffset = tab_bar->TabsNames.size();
        tab_bar->TabsNames.append(label, label + strlen(label) + 1); // Append name _with_ the zero-terminator.
    }

    // If we are not reorderable, always reset offset based on submission order.
    // (We already handled layout and sizing using the previous known order, but sizing is not affected by order!)
    if (!tab_appearing && !(tab_bar->Flags & ImGuiTabBarFlags_Reorderable))
    {
        tab->Offset = tab_bar->OffsetNextTab;
        tab_bar->OffsetNextTab += tab->Width + g.Style.ItemInnerSpacing.x;
    }

    // Update selected tab
    if (tab_appearing && (tab_bar->Flags & ImGuiTabBarFlags_AutoSelectNewTabs) && tab_bar->NextSelectedTabId == 0)
        if (!tab_bar_appearing || tab_bar->SelectedTabId == 0)
            tab_bar->NextSelectedTabId = id;  // New tabs gets activated
    if ((flags & ImGuiTabItemFlags_SetSelected) && (tab_bar->SelectedTabId != id)) // SetSelected can only be passed on explicit tab bar
        tab_bar->NextSelectedTabId = id;

    // Lock visibility
    bool tab_contents_visible = (tab_bar->VisibleTabId == id);
    if (tab_contents_visible)
        tab_bar->VisibleTabWasSubmitted = true;

    // On the very first frame of a tab bar we let first tab contents be visible to minimize appearing glitches
    if (!tab_contents_visible && tab_bar->SelectedTabId == 0 && tab_bar_appearing && docked_window == NULL)
        if (tab_bar->Tabs.Size == 1 && !(tab_bar->Flags & ImGuiTabBarFlags_AutoSelectNewTabs))
            tab_contents_visible = true;

    if (tab_appearing && !(tab_bar_appearing && !tab_is_new))
    {
        PushItemFlag(ImGuiItemFlags_NoNav | ImGuiItemFlags_NoNavDefaultFocus, true);
        ItemAdd(ImRect(), id);
        PopItemFlag();
        return tab_contents_visible;
    }

    if (tab_bar->SelectedTabId == id)
        tab->LastFrameSelected = g.FrameCount;

    // Backup current layout position
    const ImVec2 backup_main_cursor_pos = window->DC.CursorPos;

    // Layout
    size.x = tab->Width;
    window->DC.CursorPos = tab_bar->BarRect.Min + ImVec2(IM_FLOOR(tab->Offset - tab_bar->ScrollingAnim), 0.0f);
    ImVec2 pos = window->DC.CursorPos;
    ImRect bb(pos, pos + size);

    // We don't have CPU clipping primitives to clip the CloseButton (until it becomes a texture), so need to add an extra draw call (temporary in the case of vertical animation)
    bool want_clip_rect = (bb.Min.x < tab_bar->BarRect.Min.x) || (bb.Max.x > tab_bar->BarRect.Max.x);
    if (want_clip_rect)
        PushClipRect(ImVec2(ImMax(bb.Min.x, tab_bar->BarRect.Min.x), bb.Min.y - 1), ImVec2(tab_bar->BarRect.Max.x, bb.Max.y), true);

    ImVec2 backup_cursor_max_pos = window->DC.CursorMaxPos;
    ItemSize(bb.GetSize(), style.FramePadding.y);
    window->DC.CursorMaxPos = backup_cursor_max_pos;

    if (!ItemAdd(bb, id))
    {
        if (want_clip_rect)
            PopClipRect();
        window->DC.CursorPos = backup_main_cursor_pos;
        return tab_contents_visible;
    }

    // Click to Select a tab
    ImGuiButtonFlags button_flags = (ImGuiButtonFlags_PressedOnClick | ImGuiButtonFlags_AllowItemOverlap);
    if (g.DragDropActive && !g.DragDropPayload.IsDataType(IMGUI_PAYLOAD_TYPE_WINDOW))
        button_flags |= ImGuiButtonFlags_PressedOnDragDropHold;
    bool hovered, held;
    bool pressed = ButtonBehavior(bb, id, &hovered, &held, button_flags);
    if (pressed)
        tab_bar->NextSelectedTabId = id;
    hovered |= (g.HoveredId == id);

    // Allow the close button to overlap unless we are dragging (in which case we don't want any overlapping tabs to be hovered)
    if (!held)
        SetItemAllowOverlap();

    // Drag and drop a single floating window node moves it
    ImGuiDockNode* node = docked_window ? docked_window->DockNode : NULL;
    const bool single_floating_window_node = node && node->IsFloatingNode() && (node->Windows.Size == 1);
    if (held && single_floating_window_node && IsMouseDragging(0, 0.0f))
    {
        // Move
        StartMouseMovingWindow(docked_window);
    }
    else if (held && !tab_appearing && IsMouseDragging(0))
    {
        // Drag and drop: re-order tabs
        float drag_distance_from_edge_x = 0.0f;
        if (!g.DragDropActive && ((tab_bar->Flags & ImGuiTabBarFlags_Reorderable) || (docked_window != NULL)))
        {
            // While moving a tab it will jump on the other side of the mouse, so we also test for MouseDelta.x
            if (g.IO.MouseDelta.x < 0.0f && g.IO.MousePos.x < bb.Min.x)
            {
                drag_distance_from_edge_x = bb.Min.x - g.IO.MousePos.x;
                if (tab_bar->Flags & ImGuiTabBarFlags_Reorderable)
                    TabBarQueueChangeTabOrder(tab_bar, tab, -1);
            }
            else if (g.IO.MouseDelta.x > 0.0f && g.IO.MousePos.x > bb.Max.x)
            {
                drag_distance_from_edge_x = g.IO.MousePos.x - bb.Max.x;
                if (tab_bar->Flags & ImGuiTabBarFlags_Reorderable)
                    TabBarQueueChangeTabOrder(tab_bar, tab, +1);
            }
        }

        // Extract a Dockable window out of it's tab bar
        if (docked_window != NULL && !(docked_window->Flags & ImGuiWindowFlags_NoMove))
        {
            // We use a variable threshold to distinguish dragging tabs within a tab bar and extracting them out of the tab bar
            bool undocking_tab = (g.DragDropActive && g.DragDropPayload.SourceId == id);

            if (!undocking_tab) //&& (!g.IO.ConfigDockingWithShift || g.IO.KeyShift)
            {
                float threshold_base = g.FontSize;
                //float threshold_base = g.IO.ConfigDockingWithShift ? g.FontSize * 0.5f : g.FontSize;
                float threshold_x = (threshold_base * 2.2f);
                float threshold_y = (threshold_base * 1.5f) + ImClamp((ImFabs(g.IO.MouseDragMaxDistanceAbs[0].x) - threshold_base * 2.0f) * 0.20f, 0.0f, threshold_base * 4.0f);
                //GetForegroundDrawList()->AddRect(ImVec2(bb.Min.x - threshold_x, bb.Min.y - threshold_y), ImVec2(bb.Max.x + threshold_x, bb.Max.y + threshold_y), IM_COL32_WHITE); // [DEBUG]

                float distance_from_edge_y = ImMax(bb.Min.y - g.IO.MousePos.y, g.IO.MousePos.y - bb.Max.y);
                if (distance_from_edge_y >= threshold_y)
                    undocking_tab = true;
                else if (drag_distance_from_edge_x > threshold_x)
                    if ((tab_bar->ReorderRequestDir < 0 && tab_bar->GetTabOrder(tab) == 0) || (tab_bar->ReorderRequestDir > 0 && tab_bar->GetTabOrder(tab) == tab_bar->Tabs.Size - 1))
                        undocking_tab = true;
            }

            if (undocking_tab)
            {
                // Undock
                DockContextQueueUndockWindow(&g, docked_window);
                g.MovingWindow = docked_window;
                g.ActiveId = g.MovingWindow->MoveId;
                g.ActiveIdClickOffset -= g.MovingWindow->Pos - bb.Min;
            }
        }
    }

#if 0
    if (hovered && g.HoveredIdNotActiveTimer > 0.50f && bb.GetWidth() < tab->ContentWidth)
    {
        // Enlarge tab display when hovering
        bb.Max.x = bb.Min.x + IM_FLOOR(ImLerp(bb.GetWidth(), tab->ContentWidth, ImSaturate((g.HoveredIdNotActiveTimer - 0.40f) * 6.0f)));
        display_draw_list = GetForegroundDrawList(window);
        TabItemBackground(display_draw_list, bb, flags, GetColorU32(ImGuiCol_TitleBgActive));
    }
#endif

    // Render tab shape
    ImDrawList* display_draw_list = window->DrawList;
    const ImU32 tab_col = GetColorU32((held || hovered) ? ImGuiCol_TabHovered : tab_contents_visible ? (tab_bar_focused ? ImGuiCol_TabActive : ImGuiCol_TabUnfocusedActive) : (tab_bar_focused ? ImGuiCol_Tab : ImGuiCol_TabUnfocused));
    TabItemBackground(display_draw_list, bb, flags, tab_col);
    RenderNavHighlight(bb, id);

    // Select with right mouse button. This is so the common idiom for context menu automatically highlight the current widget.
    const bool hovered_unblocked = IsItemHovered(ImGuiHoveredFlags_AllowWhenBlockedByPopup);
    if (hovered_unblocked && (IsMouseClicked(1) || IsMouseReleased(1)))
        tab_bar->NextSelectedTabId = id;

    if (tab_bar->Flags & ImGuiTabBarFlags_NoCloseWithMiddleMouseButton)
        flags |= ImGuiTabItemFlags_NoCloseWithMiddleMouseButton;

    // Render tab label, process close button
    const ImGuiID close_button_id = p_open ? window->GetID((void*)((intptr_t)id + 1)) : 0;
    bool just_closed = TabItemLabelAndCloseButton(display_draw_list, bb, flags, tab_bar->FramePadding, label, id, close_button_id);
    if (just_closed && p_open != NULL)
    {
        *p_open = false;
        TabBarCloseTab(tab_bar, tab);
    }

    // Restore main window position so user can draw there
    if (want_clip_rect)
        PopClipRect();
    window->DC.CursorPos = backup_main_cursor_pos;

    // Tooltip (FIXME: Won't work over the close button because ItemOverlap systems messes up with HoveredIdTimer)
    // We test IsItemHovered() to discard e.g. when another item is active or drag and drop over the tab bar (which g.HoveredId ignores)
    if (g.HoveredId == id && !held && g.HoveredIdNotActiveTimer > 0.50f && IsItemHovered())
        if (!(tab_bar->Flags & ImGuiTabBarFlags_NoTooltip))
            SetTooltip("%.*s", (int)(FindRenderedTextEnd(label) - label), label);

    return tab_contents_visible;
}